

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::ServiceDescriptor::DebugString(ServiceDescriptor *this,string *contents)

{
  int i;
  long lVar1;
  long lVar2;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  local_60.text_ = (char *)**(undefined8 **)this;
  local_60.size_ = *(int *)(*(undefined8 **)this + 1);
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_f0.text_ = (char *)0x0;
  local_f0.size_ = -1;
  local_120.text_ = (char *)0x0;
  local_120.size_ = -1;
  local_150.text_ = (char *)0x0;
  local_150.size_ = -1;
  local_180.text_ = (char *)0x0;
  local_180.size_ = -1;
  local_1b0.text_ = (char *)0x0;
  local_1b0.size_ = -1;
  local_1e0.text_ = (char *)0x0;
  local_1e0.size_ = -1;
  local_210.text_ = (char *)0x0;
  local_210.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"service $0 {\n",&local_60,&local_90,&local_c0,&local_f0,&local_120,&local_150
             ,&local_180,&local_1b0,&local_1e0,&local_210);
  anon_unknown_1::FormatLineOptions(1,*(Message **)(this + 0x18),contents);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(this + 0x20); lVar1 = lVar1 + 1) {
    MethodDescriptor::DebugString((MethodDescriptor *)(*(long *)(this + 0x28) + lVar2),1,contents);
    lVar2 = lVar2 + 0x30;
  }
  std::__cxx11::string::append((char *)contents);
  return;
}

Assistant:

void ServiceDescriptor::DebugString(string *contents) const {
  strings::SubstituteAndAppend(contents, "service $0 {\n", name());

  FormatLineOptions(1, options(), contents);

  for (int i = 0; i < method_count(); i++) {
    method(i)->DebugString(1, contents);
  }

  contents->append("}\n");
}